

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O3

int __thiscall kj::StringPtr::parseAs<int>(StringPtr *this)

{
  longlong lVar1;
  
  lVar1 = anon_unknown_39::parseSigned(this,-0x80000000,0x7fffffff);
  return (int)lVar1;
}

Assistant:

T parseInteger(const StringPtr& s) {
  if (static_cast<T>(minValue) < 0) {
    long long min = static_cast<T>(minValue);
    long long max = static_cast<T>(maxValue);
    return static_cast<T>(parseSigned(s, min, max));
  } else {
    unsigned long long max = static_cast<T>(maxValue);
    return static_cast<T>(parseUnsigned(s, max));
  }
}